

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  u8 *puVar4;
  bool bVar5;
  ushort uVar6;
  u16 uVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  undefined8 uVar13;
  ushort *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  uint uVar21;
  u32 unaff_R13D;
  u8 *local_90;
  u8 *local_60;
  
  puVar4 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar15 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar3 = pPage->pBt->usableSize;
  if ((int)(uint)puVar4[uVar12 + 7] <= nMaxFrag) {
    uVar6 = *(ushort *)(puVar4 + uVar12 + 1) << 8 | *(ushort *)(puVar4 + uVar12 + 1) >> 8;
    uVar13 = 0x10b20;
    if ((int)(uVar3 - 4) < (int)(uint)uVar6) {
LAB_0014a470:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar13,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      iVar18 = 1;
    }
    else {
      uVar16 = (uint)uVar6;
      iVar18 = 0;
      if (uVar6 != 0) {
        uVar11 = *(ushort *)(puVar4 + uVar6) << 8 | *(ushort *)(puVar4 + uVar6) >> 8;
        uVar13 = 0x10b23;
        if ((int)(uint)uVar11 <= (int)(uVar3 - 4)) {
          uVar17 = (uint)uVar11;
          if ((uVar11 != 0) &&
             ((iVar18 = 0, puVar4[uVar11] != '\0' || (puVar4[(ulong)uVar11 + 1] != '\0'))))
          goto LAB_0014a49a;
          uVar8 = *(ushort *)(puVar4 + uVar12 + 5) << 8 | *(ushort *)(puVar4 + uVar12 + 5) >> 8;
          uVar13 = 0x10b2b;
          iVar18 = uVar16 - uVar8;
          if (uVar8 <= uVar16 && iVar18 != 0) {
            uVar9 = *(ushort *)(puVar4 + (ulong)uVar6 + 2) << 8 |
                    *(ushort *)(puVar4 + (ulong)uVar6 + 2) >> 8;
            uVar21 = (uint)uVar9;
            uVar10 = (uint)uVar9 + (uint)uVar6;
            if (uVar17 == 0) {
              unaff_R13D = 0;
              uVar13 = 0x10b34;
              uVar17 = unaff_R13D;
              if ((int)uVar10 <= (int)uVar3) {
LAB_0014a7bc:
                unaff_R13D = uVar21 + uVar8;
                memmove(puVar4 + unaff_R13D,puVar4 + uVar8,(long)iVar18);
                iVar18 = 5;
                if (uVar1 < uVar15) {
                  puVar14 = (ushort *)(puVar4 + uVar1);
                  do {
                    uVar6 = *puVar14 << 8 | *puVar14 >> 8;
                    sVar20 = (short)uVar21;
                    if ((uVar6 < uVar16) || (sVar20 = (short)uVar17, (uint)uVar6 < (uint)uVar11)) {
                      *puVar14 = (uVar6 + sVar20) * 0x100 | (ushort)(uVar6 + sVar20) >> 8;
                    }
                    puVar14 = puVar14 + 1;
                    iVar18 = 5;
                  } while (puVar14 < puVar4 + uVar15);
                }
                goto LAB_0014a49a;
              }
            }
            else {
              uVar13 = 0x10b2e;
              if (uVar10 <= uVar17) {
                uVar6 = *(ushort *)(puVar4 + (ulong)uVar11 + 2) << 8 |
                        *(ushort *)(puVar4 + (ulong)uVar11 + 2) >> 8;
                unaff_R13D = (u32)uVar6;
                uVar13 = 0x10b30;
                if ((int)((uint)uVar11 + (uint)uVar6) <= (int)uVar3) {
                  memmove(puVar4 + (uVar10 + uVar6),puVar4 + uVar10,(long)(int)(uVar17 - uVar10));
                  uVar21 = (uint)uVar9 + (uint)uVar6;
                  uVar17 = unaff_R13D;
                  goto LAB_0014a7bc;
                }
              }
            }
          }
        }
        goto LAB_0014a470;
      }
    }
LAB_0014a49a:
    if (iVar18 == 5) goto LAB_0014a674;
    if (iVar18 != 0) {
      return 0xb;
    }
  }
  unaff_R13D = uVar3;
  if ((ulong)uVar2 != 0) {
    uVar6 = *(ushort *)(puVar4 + uVar12 + 5) << 8 | *(ushort *)(puVar4 + uVar12 + 5) >> 8;
    uVar19 = 0;
    local_60 = (u8 *)0x0;
    local_90 = puVar4;
    do {
      uVar11 = *(ushort *)(puVar4 + uVar19 * 2 + (ulong)uVar1) << 8 |
               *(ushort *)(puVar4 + uVar19 * 2 + (ulong)uVar1) >> 8;
      if (((uint)uVar11 < (uint)uVar6) ||
         (uVar16 = (uint)uVar11, uVar16 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar11)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10b51,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        bVar5 = true;
      }
      else {
        uVar7 = (*pPage->xCellSize)(pPage,local_90 + uVar16);
        unaff_R13D = unaff_R13D - uVar7;
        if (((int)unaff_R13D < (int)(uint)uVar6) || ((int)uVar3 < (int)((uint)uVar11 + (uint)uVar7))
           ) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10b57,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
          bVar5 = true;
        }
        else {
          *(ushort *)(puVar4 + uVar19 * 2 + (ulong)uVar1) =
               (ushort)unaff_R13D << 8 | (ushort)unaff_R13D >> 8;
          if (local_60 == (u8 *)0x0) {
            if (unaff_R13D == uVar16) {
              bVar5 = false;
              local_60 = (u8 *)0x0;
              goto LAB_0014a64a;
            }
            local_90 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            memcpy(local_90 + uVar6,puVar4 + uVar6,(long)(int)(uVar3 - uVar6));
            local_60 = local_90;
          }
          memcpy(puVar4 + unaff_R13D,local_90 + uVar16,(ulong)uVar7);
          bVar5 = false;
        }
      }
LAB_0014a64a:
      if (bVar5) {
        return 0xb;
      }
      uVar19 = uVar19 + 1;
    } while (uVar2 != uVar19);
  }
  puVar4[uVar12 + 7] = '\0';
LAB_0014a674:
  if ((uint)puVar4[uVar12 + 7] + (unaff_R13D - uVar15) == pPage->nFree) {
    *(ushort *)(puVar4 + uVar12 + 5) = (ushort)unaff_R13D << 8 | (ushort)unaff_R13D >> 8;
    (puVar4 + uVar12 + 1)[0] = '\0';
    (puVar4 + uVar12 + 1)[1] = '\0';
    iVar18 = 0;
    memset(puVar4 + uVar15,0,(long)(int)(unaff_R13D - uVar15));
  }
  else {
    iVar18 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10b6a,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  }
  return iVar18;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( NEVER(iFree+sz>usableSize) ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellStart || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellStart && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellStart || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellStart );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      memcpy(&temp[iCellStart], &data[iCellStart], usableSize - iCellStart);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}